

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

int __thiscall Clasp::UncoreMinimize::init(UncoreMinimize *this,EVP_PKEY_CTX *ctx)

{
  wsum_t wVar1;
  UncoreMinimize *unaff_retaddr;
  uint32 in_stack_ffffffffffffffec;
  
  releaseLits(unaff_retaddr);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear(&this->fix_);
  this->eRoot_ = 0;
  this->aTop_ = 0;
  wVar1 = SharedMinimizeData::upper((SharedMinimizeData *)this,in_stack_ffffffffffffffec);
  this->upper_ = wVar1;
  this->lower_ = 0;
  this->gen_ = 0;
  *(uint *)&this->field_0xec = *(uint *)&this->field_0xec & 0xf0000000;
  *(uint *)&this->field_0xec = *(uint *)&this->field_0xec & 0xefffffff;
  *(uint *)&this->field_0xec = *(uint *)&this->field_0xec & 0xdfffffff;
  *(uint *)&this->field_0xec = *(uint *)&this->field_0xec & 0xbfffffff | 0x40000000;
  *(uint *)&this->field_0xec = *(uint *)&this->field_0xec & 0x7fffffff | 0x80000000;
  this->actW_ = 1;
  this->nextW_ = 0;
  return (int)this;
}

Assistant:

void UncoreMinimize::init() {
	releaseLits();
	fix_.clear();
	eRoot_ = 0;
	aTop_  = 0;
	upper_ = shared_->upper(0);
	lower_ = 0;
	gen_   = 0;
	level_ = 0;
	next_  = 0;
	disj_  = 0;
	path_  = 1;
	init_  = 1;
	actW_  = 1;
	nextW_ = 0;
}